

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O2

void __thiscall ArchiveSpan_ReadSpan_Test::TestBody(ArchiveSpan_ReadSpan_Test *this)

{
  undefined8 uVar1;
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *this_00;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_01;
  TypedExpectation<void_(int_&)> *this_02;
  TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this_03;
  char *message;
  span<int,__1L> args;
  AssertionResult gtest_ar;
  array<int,_3UL> arr;
  MatcherBase<pstore::gsl::span<int,__1L>_> local_180;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  mock_span_archive archive;
  
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::mock_span_archive(&archive);
  stack0xfffffffffffffe68 =
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  arr._M_elems._0_8_ = &PTR__MatcherBase_00187b40;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_put
            ((MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *)&gtest_ar,&archive,
             (Matcher<const_int_&> *)&arr);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
            InternalExpectedAt((MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *)
                               &gtest_ar,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x153,"archive","put (_)");
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::Times
            (this_00,0);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)&gtest_ar.message_);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&arr);
  stack0xfffffffffffffe68 =
       testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  arr._M_elems._0_8_ = &PTR__MatcherBase_00187ef8;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_putn_mock
            ((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *)
             &gtest_ar,&archive,(Matcher<pstore::gsl::span<int,__1L>_> *)&arr);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            InternalExpectedAt((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
                                *)&gtest_ar,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x154,"archive","putn_mock (_)");
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
            (this_01,0);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)&gtest_ar.message_);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)&arr);
  stack0xfffffffffffffe68 =
       testing::internal::MatcherBase<int&>::
       GetVTable<testing::internal::MatcherBase<int&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  arr._M_elems._0_8_ = &PTR__MatcherBase_00187ca0;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_get
            ((MockSpec<void_(int_&)> *)&gtest_ar,&archive,(Matcher<int_&> *)&arr);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      ((MockSpec<void_(int_&)> *)&gtest_ar,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x155,"archive","get (_)");
  testing::internal::TypedExpectation<void_(int_&)>::Times(this_02,0);
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)&gtest_ar.message_);
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)&arr);
  local_180.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_180.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00187ef8;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_getn_mock
            ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)&arr,&archive,
             (Matcher<pstore::gsl::span<int,__1L>_> *)&local_180);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::InternalExpectedAt
                      ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)&arr,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x156,"archive","getn_mock (_)");
  local_168._M_unused._M_object = &DAT_110000000d;
  local_168._8_8_ = 0x13;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_158 = std::
              _Function_handler<void_(pstore::gsl::span<int,_-1L>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp:343:28)>
              ::_M_manager;
  local_150 = std::
              _Function_handler<void_(pstore::gsl::span<int,_-1L>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp:343:28)>
              ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::WillOnce
            (this_03,(Action<void_(pstore::gsl::span<int,__1L>)> *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)(arr._M_elems + 2));
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase(&local_180);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar._0_8_ = &local_168;
  local_168._M_unused._M_object = (MockSpec<void_(pstore::gsl::span<int,__1L>)> *)&arr;
  while ((uVar1 = local_168._M_unused._0_8_, (_Any_data *)gtest_ar._0_8_ != &local_168 ||
         ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x3))) {
    pstore::gsl::details::span_iterator<pstore::gsl::span<int,_3L>,_false>::operator*
              ((span_iterator<pstore::gsl::span<int,_3L>,_false> *)&gtest_ar);
    pstore::gsl::details::span_iterator<pstore::gsl::span<int,_3L>,_false>::operator++
              ((span_iterator<pstore::gsl::span<int,_3L>,_false> *)&gtest_ar);
  }
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            (&archive.gmock01_getn_mock_286.super_UntypedFunctionMockerBase,&archive,"getn_mock");
  args.storage_.data_ = (pointer)uVar1;
  args.storage_.super_extent_type<_1L>.size_ = 3;
  testing::internal::FunctionMocker<void_(pstore::gsl::span<int,_-1L>)>::Invoke
            (&archive.gmock01_getn_mock_286,args);
  local_168._M_unused._M_object = &DAT_110000000d;
  local_168._8_4_ = 0x13;
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<int,3ul>>>>
  ::operator()(&gtest_ar,local_168._M_pod_data,(array<int,_3UL> *)"arr");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_168);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
               ,0x15d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)local_168._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_168._M_unused._M_object + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::~mock_span_archive(&archive);
  return;
}

Assistant:

TEST_F (ArchiveSpan, ReadSpan) {
    using ::testing::_;
    using ::testing::ContainerEq;
    using ::testing::Invoke;

    std::array<int, 3> const expected{{13, 17, 19}};

    mock_span_archive archive;
    EXPECT_CALL (archive, put (_)).Times (0);
    EXPECT_CALL (archive, putn_mock (_)).Times (0);
    EXPECT_CALL (archive, get (_)).Times (0);
    EXPECT_CALL (archive, getn_mock (_))
        .WillOnce (Invoke ([expected] (::pstore::gsl::span<int> sp) {
            std::copy (std::begin (expected), std::end (expected), std::begin (sp));
        }));

    std::array<int, 3> arr;
    pstore::serialize::read (archive, pstore::gsl::make_span (arr));
    EXPECT_THAT (arr, ContainerEq (expected));
}